

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::NewLoopNode
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,CharCount lower,
          CharCountOrFlag upper,bool isGreedy,Node *body)

{
  Node *pNVar1;
  
  pNVar1 = body;
  if (upper != 1 || lower != 1) {
    if (upper == 0 && lower == 0) {
      pNVar1 = (Node *)new<Memory::ArenaAllocator>(0x38,this->ctAllocator,0x364470);
      pNVar1->tag = Empty;
      pNVar1->features = 0;
      *(uint *)&pNVar1->field_0xc = *(uint *)&pNVar1->field_0xc & 0xffff8000;
      pNVar1->firstSet = (CharSet<char16_t> *)0x0;
      pNVar1->followSet = (CharSet<char16_t> *)0x0;
      (pNVar1->prevConsumes).lower = 0;
      *(undefined8 *)&(pNVar1->prevConsumes).upper = 0xffffffff;
      *(undefined8 *)&(pNVar1->thisConsumes).upper = 0xffffffff;
      (pNVar1->followConsumes).upper = 0xffffffff;
      pNVar1->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542770;
    }
    else {
      pNVar1 = (Node *)new<Memory::ArenaAllocator>(0x50,this->ctAllocator,0x364470);
      pNVar1->tag = Loop;
      pNVar1->features = 0;
      *(uint *)&pNVar1->field_0xc = *(uint *)&pNVar1->field_0xc & 0xffff8000;
      pNVar1->firstSet = (CharSet<char16_t> *)0x0;
      pNVar1->followSet = (CharSet<char16_t> *)0x0;
      (pNVar1->prevConsumes).lower = 0;
      *(undefined8 *)&(pNVar1->prevConsumes).upper = 0xffffffff;
      *(undefined8 *)&(pNVar1->thisConsumes).upper = 0xffffffff;
      (pNVar1->followConsumes).upper = 0xffffffff;
      pNVar1->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542f50;
      pNVar1[1]._vptr_Node = (_func_int **)body;
      pNVar1[1].tag = (short)lower;
      pNVar1[1].features = (short)(lower >> 0x10);
      *(CharCountOrFlag *)&pNVar1[1].field_0xc = upper;
      *(undefined2 *)&pNVar1[1].firstSet = 0xffff;
      *(bool *)((long)&pNVar1[1].firstSet + 2) = isGreedy;
      *(undefined4 *)((long)&pNVar1[1].firstSet + 4) = 0;
    }
  }
  return pNVar1;
}

Assistant:

Node* Parser<P, IsLiteral>::NewLoopNode(CharCount lower, CharCountOrFlag upper, bool isGreedy, Node* body)
    {
        //
        // NOTE: We'd like to represent r? (i.e. r{0,1}) as r|<empty> since the loop representation has high overhead.
        //       HOWEVER if r contains a group definition and could match empty then we must execute as a loop
        //       so that group bindings are correctly reset on no progress (e.g.: /(a*)?/.exec("")). Thus we defer
        //       this optimization until pass 4 of the optimizer, at which point we know whether r could match empty.
        //
        if (lower == 1 && upper == 1)
            return body;
        else if (lower == 0 && upper == 0)
            // Loop is equivalent to empty. If the loop body contains group definitions they will have already been
            // counted towards the overall number of groups. The matcher will initialize their contents to
            // undefined, and since the loop body would never execute the inner groups could never be updated from
            // undefined.
            return Anew(ctAllocator, SimpleNode, Node::Empty);
        else
            return Anew(ctAllocator, LoopNode, lower, upper, isGreedy, body);
    }